

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool anon_unknown.dwarf_52fdc::parse_str_to_bool(string *s)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)s);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)s);
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

bool parse_str_to_bool(const std::string & s) {
    if (s == "true" || s == "1" || s == "yes" || s == "y") {
        return true;
    }
    return false;
}